

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util_test.cc
# Opt level: O0

void anon_unknown.dwarf_3336::Test_TemplateTestUtilTest_IsHiddenSection::Run(void)

{
  TemplateString TVar1;
  bool bVar2;
  TemplateString local_118;
  TemplateDictionaryPeer local_f8;
  TemplateDictionaryPeer peer_1;
  size_t sStack_e8;
  undefined8 local_e0;
  TemplateId TStack_d8;
  TemplateString local_d0;
  TemplateDictionaryPeer local_a0;
  TemplateDictionaryPeer peer;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer,"test_IsHiddenSection");
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_78,(TemplateString *)&peer,(UnsafeArena *)0x0);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_a0,local_78);
  ctemplate::TemplateString::TemplateString(&local_d0,"SECTION");
  bVar2 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_a0,&local_d0);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","peer.IsHiddenSection(\"SECTION\")");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&peer_1,"SECTION");
  TVar1.length_ = sStack_e8;
  TVar1.ptr_ = (char *)peer_1.dict_;
  TVar1._16_8_ = local_e0;
  TVar1.id_ = TStack_d8;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar1);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_f8,local_78);
  ctemplate::TemplateString::TemplateString(&local_118,"SECTION");
  bVar2 = ctemplate::TemplateDictionaryPeer::IsHiddenSection(&local_f8,&local_118);
  if (!bVar2) {
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  fprintf(_stderr,"Check failed: %s\n","!(peer.IsHiddenSection(\"SECTION\"))");
  exit(1);
}

Assistant:

TEST(TemplateTestUtilTest, IsHiddenSection) {
  TemplateDictionary dict("test_IsHiddenSection");

  {
    TemplateDictionaryPeer peer(&dict);
    EXPECT_TRUE(peer.IsHiddenSection("SECTION"));
  }

  dict.AddSectionDictionary("SECTION");

  {
    TemplateDictionaryPeer peer(&dict);
    EXPECT_FALSE(peer.IsHiddenSection("SECTION"));
  }
}